

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbuffer.c
# Opt level: O0

entry_t * bounded_buffer_get(bounded_buffer_t *bb)

{
  int iVar1;
  entry_t *peVar2;
  entry_t *entry;
  bounded_buffer_t *bb_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&bb->lock);
  while (bb->tail == bb->head) {
    pthread_cond_wait((pthread_cond_t *)&bb->has_items,(pthread_mutex_t *)&bb->lock);
  }
  peVar2 = bb->entries[bb->head % bb->size];
  iVar1 = bb->head;
  bb->head = iVar1 + 1;
  bb->entries[iVar1 % bb->size] = (entry_t *)0x0;
  pthread_cond_signal((pthread_cond_t *)&bb->has_space);
  pthread_mutex_unlock((pthread_mutex_t *)&bb->lock);
  return peVar2;
}

Assistant:

entry_t* bounded_buffer_get(bounded_buffer_t* bb)
{
    pthread_mutex_lock(&bb->lock);

    while (bb->tail == bb->head)
    {
        pthread_cond_wait(&bb->has_items, &bb->lock);
    }

    entry_t* entry = bb->entries[bb->head % bb->size];
    bb->entries[bb->head++ % bb->size] = NULL;
    pthread_cond_signal(&bb->has_space);

    pthread_mutex_unlock(&bb->lock);
    return entry;
}